

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trie.hpp
# Opt level: O1

bool __thiscall CppJieba::Trie::_insert(Trie *this,TrieNodeInfo *nodeInfo)

{
  ushort uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  bool bVar4;
  pointer puVar5;
  __node_base_ptr p_Var6;
  mapped_type *ppTVar7;
  mapped_type pTVar8;
  ulong uVar9;
  ulong uVar10;
  __node_base_ptr p_Var11;
  ulong uVar12;
  mapped_type this_00;
  bool bVar13;
  uint16_t cu;
  string local_50;
  
  if (this->_initFlag == false) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"not initted!","");
    Limonp::Logger::LoggingF(4,"Trie.hpp",0x108,&local_50);
  }
  else {
    pTVar8 = this->_root;
    puVar5 = (nodeInfo->word).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_start;
    bVar13 = (nodeInfo->word).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
             _M_impl.super__Vector_impl_data._M_finish != puVar5;
    if (bVar13) {
      uVar12 = 0;
      this_00 = pTVar8;
      do {
        uVar1 = puVar5[uVar12];
        local_50._M_dataplus._M_p._0_2_ = uVar1;
        if (this_00 == (mapped_type)0x0) {
          pTVar8 = (mapped_type)0x0;
          bVar4 = false;
        }
        else {
          uVar9 = (this_00->hmap)._M_h._M_bucket_count;
          uVar10 = (ulong)uVar1 % uVar9;
          p_Var2 = (this_00->hmap)._M_h._M_buckets[uVar10 & 0xffffffff];
          p_Var6 = (__node_base_ptr)0x0;
          if ((p_Var2 != (__node_base_ptr)0x0) &&
             (p_Var6 = p_Var2, p_Var11 = p_Var2->_M_nxt,
             uVar1 != *(ushort *)&p_Var2->_M_nxt[1]._M_nxt)) {
            while (p_Var3 = p_Var11->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
              p_Var6 = (__node_base_ptr)0x0;
              if (((ulong)*(ushort *)&p_Var3[1]._M_nxt % uVar9 != uVar10) ||
                 (p_Var6 = p_Var11, p_Var11 = p_Var3, uVar1 == *(ushort *)&p_Var3[1]._M_nxt))
              goto LAB_00110d40;
            }
            p_Var6 = (__node_base_ptr)0x0;
          }
LAB_00110d40:
          if ((p_Var6 == (__node_base_ptr)0x0) || (p_Var6->_M_nxt == (_Hash_node_base *)0x0)) {
            pTVar8 = (mapped_type)operator_new(0x40);
            (pTVar8->hmap)._M_h._M_buckets = &(pTVar8->hmap)._M_h._M_single_bucket;
            (pTVar8->hmap)._M_h._M_bucket_count = 1;
            (pTVar8->hmap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
            (pTVar8->hmap)._M_h._M_element_count = 0;
            (pTVar8->hmap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
            pTVar8->nodeInfoVecPos = 0;
            (pTVar8->hmap)._M_h._M_rehash_policy._M_next_resize = 0;
            (pTVar8->hmap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
            pTVar8->isLeaf = false;
            ppTVar7 = std::__detail::
                      _Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_00,(key_type *)&local_50);
            *ppTVar7 = pTVar8;
            bVar4 = true;
          }
          else {
            ppTVar7 = std::__detail::
                      _Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                      ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_CppJieba::TrieNode_*>,_std::allocator<std::pair<const_unsigned_short,_CppJieba::TrieNode_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                    *)this_00,(key_type *)&local_50);
            pTVar8 = *ppTVar7;
            bVar4 = true;
          }
        }
        if (!bVar4) break;
        uVar12 = (ulong)((int)uVar12 + 1);
        puVar5 = (nodeInfo->word).
                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = (long)(nodeInfo->word).
                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar5 >> 1;
        bVar13 = uVar12 < uVar9;
        this_00 = pTVar8;
      } while (uVar12 < uVar9);
    }
    if (bVar13) {
      return false;
    }
    if (pTVar8 == (mapped_type)0x0) {
      return false;
    }
    if (pTVar8->isLeaf != true) {
      pTVar8->isLeaf = true;
      std::vector<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>::push_back
                (&this->_nodeInfoVec,nodeInfo);
      pTVar8->nodeInfoVecPos =
           (int)((ulong)((long)(this->_nodeInfoVec).
                               super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->_nodeInfoVec).
                              super__Vector_base<CppJieba::TrieNodeInfo,_std::allocator<CppJieba::TrieNodeInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x38e38e39 - 1;
      return true;
    }
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"this node already _inserted","");
    Limonp::Logger::LoggingF(3,"Trie.hpp",0x12f,&local_50);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return false;
}

Assistant:

bool _insert(const TrieNodeInfo& nodeInfo)
            {
                if(!_getInitFlag())
                {
                    LogFatal("not initted!");
                    return false;
                }


                const Unicode& uintVec = nodeInfo.word;
                TrieNode* p = _root;
                for(uint i = 0; i < uintVec.size(); i++)
                {
                    uint16_t cu = uintVec[i];
                    if(NULL == p)
                    {
                        return false;
                    }
                    if(p->hmap.end() == p->hmap.find(cu))
                    {
                        TrieNode * next = NULL;
                        try
                        {
                            next = new TrieNode;
                        }
                        catch(const bad_alloc& e)
                        {
                            return false;
                        }
                        p->hmap[cu] = next;
                        p = next;
                    }
                    else
                    {
                        p = p->hmap[cu];
                    }
                }
                if(NULL == p)
                {
                    return false;
                }
                if(p->isLeaf)
                {
                    LogError("this node already _inserted");
                    return false;
                }

                p->isLeaf = true;
                _nodeInfoVec.push_back(nodeInfo);
                p->nodeInfoVecPos = _nodeInfoVec.size() - 1;

                return true;
            }